

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O3

void lm_trie_fix_counts(ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *fixed_counts,int order)

{
  int iVar1;
  uint uVar2;
  ngram_raw_t *pnVar3;
  void *__src;
  undefined8 uVar4;
  priority_queue_t *queue;
  undefined8 *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 words [5];
  uint32 raw_ngram_ptrs [4];
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  uint32 *local_50;
  uint auStack_48 [6];
  
  queue = priority_queue_create((long)(order + -1),ngram_ord_comparator);
  local_68 = 0xffffffffffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0xffffffff;
  local_50 = fixed_counts;
  memcpy(fixed_counts,counts,(long)order * 4);
  if (1 < order) {
    uVar7 = 2;
    do {
      if (counts[uVar7 - 1] != 0) {
        auStack_48[uVar7 - 2] = 0;
        puVar5 = (undefined8 *)
                 __ckd_calloc__(1,0x18,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                ,0xca);
        pnVar3 = raw_ngrams[uVar7 - 2];
        puVar5[2] = *(undefined8 *)&pnVar3->order;
        uVar4 = *(undefined8 *)&pnVar3->prob;
        *puVar5 = pnVar3->words;
        puVar5[1] = uVar4;
        *(int *)(puVar5 + 2) = (int)uVar7;
        priority_queue_add(queue,puVar5);
      }
      uVar7 = uVar7 + 1;
    } while (order + 1 != uVar7);
  }
  do {
    sVar6 = priority_queue_size(queue);
    if (sVar6 == 0) {
      sVar6 = priority_queue_size(queue);
      if (sVar6 != 0) {
        __assert_fail("priority_queue_size(ngrams) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0xf4,"void lm_trie_fix_counts(ngram_raw_t **, uint32 *, uint32 *, int)");
      }
      priority_queue_free(queue,(_func_void_void_ptr *)0x0);
      return;
    }
    puVar5 = (undefined8 *)priority_queue_poll(queue);
    iVar1 = *(int *)(puVar5 + 2);
    if (iVar1 == 2) {
      local_68 = *(undefined8 *)*puVar5;
      uVar7 = 1;
    }
    else {
      __src = (void *)*puVar5;
      if (iVar1 - 1U == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(iVar1 - 1U);
        uVar8 = 0;
        do {
          if (*(int *)((long)&local_68 + uVar8 * 4) != *(int *)((long)__src + uVar8 * 4)) {
            uVar7 = uVar8 & 0xffffffff;
            if ((uint)uVar8 < 2) {
              uVar7 = 1;
            }
            memcpy(&local_68,__src,uVar7 * 4 + 4);
            local_50[uVar7] = local_50[uVar7] + 1;
            iVar1 = *(int *)(puVar5 + 2);
            uVar7 = (ulong)(iVar1 - 1);
            *(undefined4 *)((long)&local_68 + uVar7 * 4) = *(undefined4 *)((long)__src + uVar7 * 4);
            uVar8 = (ulong)(iVar1 - 2);
            goto LAB_00111894;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      *(undefined4 *)((long)&local_68 + uVar7 * 4) = *(undefined4 *)((long)__src + uVar7 * 4);
    }
    uVar8 = (ulong)(iVar1 - 2);
    auStack_48[uVar8] = auStack_48[uVar8] + 1;
LAB_00111894:
    uVar2 = auStack_48[uVar8];
    if (uVar2 < counts[uVar7]) {
      pnVar3 = raw_ngrams[uVar8];
      puVar5[2] = *(undefined8 *)&pnVar3[uVar2].order;
      pnVar3 = pnVar3 + uVar2;
      uVar4 = *(undefined8 *)&pnVar3->prob;
      *puVar5 = pnVar3->words;
      puVar5[1] = uVar4;
      priority_queue_add(queue,puVar5);
    }
    else {
      ckd_free(puVar5);
    }
  } while( true );
}

Assistant:

void
lm_trie_fix_counts(ngram_raw_t ** raw_ngrams, uint32 * counts,
                   uint32 * fixed_counts, int order)
{
    priority_queue_t *ngrams =
        priority_queue_create(order - 1, &ngram_ord_comparator);
    uint32 raw_ngram_ptrs[NGRAM_MAX_ORDER - 1];
    uint32 words[NGRAM_MAX_ORDER];
    int i;

    memset(words, -1, sizeof(words));
    memcpy(fixed_counts, counts, order * sizeof(*fixed_counts));
    for (i = 2; i <= order; i++) {
        ngram_raw_t *tmp_ngram;
        
        if (counts[i - 1] <= 0)
            continue;

        raw_ngram_ptrs[i - 2] = 0;

        tmp_ngram =
            (ngram_raw_t *) ckd_calloc(1, sizeof(*tmp_ngram));
        *tmp_ngram = raw_ngrams[i - 2][0];
        tmp_ngram->order = i;
        priority_queue_add(ngrams, tmp_ngram);
    }

    for (;;) {
        int32 to_increment = TRUE;
        ngram_raw_t *top;
        if (priority_queue_size(ngrams) == 0) {
            break;
        }
        top = (ngram_raw_t *) priority_queue_poll(ngrams);
        if (top->order == 2) {
            memcpy(words, top->words, 2 * sizeof(*words));
        }
        else {
            for (i = 0; (uint32)i < top->order - 1; i++) {
                if (words[i] != top->words[i]) {
                    int num;
                    num = (i == 0) ? 1 : i;
                    memcpy(words, top->words,
                           (num + 1) * sizeof(*words));
                    fixed_counts[num]++;
                    to_increment = FALSE;
                    break;
                }
            }
            words[top->order - 1] = top->words[top->order - 1];
        }
        if (to_increment) {
            raw_ngram_ptrs[top->order - 2]++;
        }
        if (raw_ngram_ptrs[top->order - 2] < counts[top->order - 1]) {
            *top = raw_ngrams[top->order - 2][raw_ngram_ptrs[top->order - 2]];
            priority_queue_add(ngrams, top);
        }
        else {
            ckd_free(top);
        }
    }

    assert(priority_queue_size(ngrams) == 0);
    priority_queue_free(ngrams, NULL);
}